

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

void __thiscall slang::ast::DefParamVisitor::~DefParamVisitor(DefParamVisitor *this)

{
  value_type_pointer p;
  pointer p_00;
  
  p = (this->activeInstances).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
      .arrays.elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(this->activeInstances).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                      .arrays.groups_size_mask * 0x88 + 0x90);
  }
  p_00 = (this->found).super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.data_;
  if (p_00 != (pointer)(this->found).super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.
                       firstElement) {
    operator_delete(p_00);
    return;
  }
  return;
}

Assistant:

DefParamVisitor(size_t maxInstanceDepth, size_t generateLevel) :
        maxInstanceDepth(maxInstanceDepth), generateLevel(generateLevel) {}